

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O1

void generateChessTexture
               (PatternGeneration *pattern_generation,uint *resolution,uint *i,string *textures_dir,
               string *scripts_dir)

{
  Scalar_ *pSVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  undefined1 local_28b8 [8];
  mt19937 mt;
  random_device rd;
  Mat chess_board;
  _InputArray local_148;
  undefined1 local_130 [8];
  Scalar chess_color_1;
  undefined1 local_110 [8];
  Scalar chess_color_2;
  param_type local_f0;
  uniform_int_distribution<int> dist;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string material_name;
  string img_name;
  string img_filename;
  
  local_90 = (undefined1  [8])&material_name._M_string_length;
  material_name._M_dataplus._M_p = (pointer)0x0;
  material_name._M_string_length._0_1_ = 0;
  material_name.field_2._8_8_ = &img_name._M_string_length;
  img_name._M_dataplus._M_p = (pointer)0x0;
  img_name._M_string_length._0_1_ = 0;
  img_name.field_2._8_8_ = &img_filename._M_string_length;
  img_filename._M_dataplus._M_p = (pointer)0x0;
  img_filename._M_string_length._0_1_ = 0;
  genNames("chess_",*i,textures_dir,(string *)local_90,(string *)((long)&material_name.field_2 + 8),
           (string *)((long)&img_name.field_2 + 8));
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_90,material_name._M_dataplus._M_p + (long)local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,material_name.field_2._8_8_,
             img_name._M_dataplus._M_p + material_name.field_2._8_8_);
  genScript(&local_d0,&local_b0,scripts_dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  std::random_device::random_device((random_device *)&mt._M_p);
  uVar3 = std::random_device::_M_getval();
  local_28b8 = (undefined1  [8])(ulong)uVar3;
  lVar6 = 1;
  uVar4 = (ulong)local_28b8;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar6);
    mt._M_x[lVar6 + -1] = uVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  mt._M_x[0x26f] = 0x270;
  local_f0._M_a = 0;
  local_f0._M_b = 0x7fffffff;
  std::uniform_int_distribution<int>::operator()
            ((uniform_int_distribution<int> *)&local_f0,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_28b8,&local_f0);
  PatternGeneration::getRandomColor();
  PatternGeneration::getRandomColor();
  pSVar1 = (Scalar_ *)((long)&rd.field_0 + 0x1380);
  PatternGeneration::getChessTexture
            (pSVar1,(Scalar_ *)pattern_generation,(int)local_130,(int)local_110);
  local_148.sz.width = 0;
  local_148.sz.height = 0;
  local_148.flags = 0x1010000;
  dist._M_param._M_a = 0;
  dist._M_param._M_b = 0;
  local_148.obj = pSVar1;
  cVar2 = cv::imwrite((string *)(img_name.field_2._M_local_buf + 8),&local_148,(vector *)&dist);
  if (dist._M_param != (param_type)0x0) {
    operator_delete((void *)dist._M_param);
  }
  if (cVar2 != '\0') {
    cv::Mat::~Mat((Mat *)((long)&rd.field_0 + 0x1380));
    std::random_device::_M_fini();
    if ((size_type *)img_name.field_2._8_8_ != &img_filename._M_string_length) {
      operator_delete((void *)img_name.field_2._8_8_);
    }
    if ((size_type *)material_name.field_2._8_8_ != &img_name._M_string_length) {
      operator_delete((void *)material_name.field_2._8_8_);
    }
    if (local_90 != (undefined1  [8])&material_name._M_string_length) {
      operator_delete((void *)local_90);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[ERROR] Could not save ",0x17);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)img_name.field_2._8_8_,
                      (long)img_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,". Please ensure the destination folder exists!",0x2e);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

void generateChessTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{
    std::string material_name, img_name, img_filename;
    genNames("chess_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;

    /* Initialize random device */
    std::random_device rd;
    std::mt19937 mt(rd());
    std::uniform_int_distribution<int> dist;
    int squares;
    int block_size;
    /* Generate square texture */
    squares = dist(mt) % 20 + 8;     // v2 in the range 1 to 100
    block_size = resolution / squares;
    if (block_size % 2 == 0)
        block_size++;

    cv::Scalar chess_color_1    = pattern_generation.getRandomColor();
    cv::Scalar chess_color_2    = pattern_generation.getRandomColor();

    cv::Mat chess_board = pattern_generation.getChessTexture(chess_color_1, chess_color_2, block_size, squares);

    // Convert to HSV
    //cv::applyColorMap(chess_board, chess_board, cv::COLORMAP_LAB);

    if (!cv::imwrite(img_filename, chess_board)){
        std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Chess board", chess_board);

}